

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::typedef_<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  size_t sVar1;
  bool bVar2;
  undefined1 auVar3 [8];
  string_view expected;
  Name name;
  string local_c8;
  undefined1 local_a8 [8];
  Result<wasm::Ok> sub;
  undefined1 local_60 [8];
  Result<wasm::Ok> _val;
  
  sVar1 = (ctx->in).pos;
  expected._M_str = "type";
  expected._M_len = 4;
  bVar2 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar2) {
    Lexer::takeID((optional<wasm::Name> *)local_a8,&ctx->in);
    if (sub.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ == '\0') {
      _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\0';
      _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._33_7_ = 0;
      auVar3 = (undefined1  [8])0x0;
    }
    else {
      _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ =
           sub.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
      auVar3 = local_a8;
    }
    subtype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_a8,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_60,
               (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_a8);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&sub.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),(string *)local_60);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&sub.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&sub.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
      bVar2 = Lexer::takeRParen(&ctx->in);
      if (bVar2) {
        name.super_IString.str._M_str =
             (char *)_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
        name.super_IString.str._M_len = (size_t)auVar3;
        ParseDeclsCtx::finishTypeDef(ctx,name,(Index)sVar1);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"expected end of type definition",
                   (allocator<char> *)
                   ((long)&sub.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        Lexer::err((Err *)local_60,&ctx->in,&local_c8);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_60);
        std::__cxx11::string::~string((string *)local_60);
        std::__cxx11::string::~string((string *)&local_c8);
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_a8);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> typedef_(Ctx& ctx) {
  auto pos = ctx.in.getPos();

  if (!ctx.in.takeSExprStart("type"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto sub = subtype(ctx);
  CHECK_ERR(sub);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of type definition");
  }

  ctx.finishTypeDef(name, pos);
  return Ok{};
}